

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  uint32_t uVar7;
  int iVar8;
  HuffmanCode *pHVar9;
  uint32_t uVar10;
  size_t sVar11;
  ulong in_RSI;
  uint32_t *puVar12;
  uint64_t uVar13;
  uint uVar14;
  HuffmanCode *table;
  bool bVar15;
  uint32_t block_type;
  uint32_t index;
  uint local_48;
  uint local_44;
  size_t local_40;
  uint64_t local_38;
  
  uVar3 = s->num_block_types[2];
  if (uVar3 < 2) {
    return 0;
  }
  br = &s->br;
  local_38 = (s->br).val_;
  uVar4 = (s->br).bit_pos_;
  puVar5 = (s->br).next_in;
  local_40 = (s->br).avail_in;
  bVar15 = uVar4 - 0x32 < 0xf;
  uVar10 = uVar4;
  if (bVar15) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar13 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      uVar7 = uVar4;
      do {
        uVar10 = uVar7 - 8;
        sVar11 = sVar11 - 1;
        in_RSI = uVar13 >> 8;
        (s->br).val_ = in_RSI;
        uVar13 = (ulong)*pbVar6 << 0x38 | uVar13 >> 8;
        (s->br).val_ = uVar13;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar6 + 1;
        bVar15 = uVar7 - 0x3a < 0xf;
        if (!bVar15) goto LAB_0014353a;
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar10;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_0014353a:
    in_RSI = (ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
  }
  puVar12 = (uint32_t *)(s->block_type_trees + 0x4f0);
  table = s->block_len_trees + 0x318;
  if (bVar15) {
    iVar8 = SafeDecodeSymbol((HuffmanCode *)puVar12,br,&local_48);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar9 = (HuffmanCode *)puVar12 + (in_RSI & 0xff);
    bVar2 = pHVar9->bits;
    if (8 < bVar2) {
      puVar12 = &(s->br).bit_pos_;
      *puVar12 = *puVar12 + 8;
      puVar12 = kBitMask;
      pHVar9 = pHVar9 + (((uint)(in_RSI >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                        (uint)pHVar9->value);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar9->bits;
    local_48 = (uint)pHVar9->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar10 = (s->br).bit_pos_;
    bVar15 = uVar10 - 0x32 < 0xf;
    if (bVar15) {
      sVar11 = (s->br).avail_in;
      if (sVar11 != 0) {
        uVar13 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        uVar7 = uVar10;
        do {
          uVar10 = uVar7 - 8;
          sVar11 = sVar11 - 1;
          puVar12 = (uint32_t *)(uVar13 >> 8);
          (s->br).val_ = (uint64_t)puVar12;
          uVar13 = (ulong)*pbVar6 << 0x38 | uVar13 >> 8;
          (s->br).val_ = uVar13;
          (s->br).bit_pos_ = uVar10;
          (s->br).avail_in = sVar11;
          (s->br).next_in = pbVar6 + 1;
          bVar15 = uVar7 - 0x3a < 0xf;
          if (!bVar15) goto LAB_0014361a;
          pbVar6 = pbVar6 + 1;
          uVar7 = uVar10;
        } while (sVar11 != 0);
      }
    }
    else {
LAB_0014361a:
      puVar12 = (uint32_t *)(ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
    }
    if (bVar15) {
      iVar8 = SafeDecodeSymbol(table,br,&local_44);
      if (iVar8 == 0) goto LAB_0014373e;
    }
    else {
      pHVar9 = table + ((ulong)puVar12 & 0xff);
      bVar2 = pHVar9->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar9 = pHVar9 + (((uint)((ulong)puVar12 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                          (uint)pHVar9->value);
      }
      puVar12 = &(s->br).bit_pos_;
      *puVar12 = *puVar12 + (uint)pHVar9->bits;
      local_44 = (uint)pHVar9->value;
    }
  }
  else {
    local_44 = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_44].nbits;
  uVar10 = (s->br).bit_pos_;
  bVar15 = 0x40 - uVar10 < (uint)bVar2;
  if (bVar15) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar13 = (s->br).val_;
      uVar14 = 0x48 - uVar10;
      pbVar6 = (s->br).next_in;
      do {
        uVar10 = uVar10 - 8;
        sVar11 = sVar11 - 1;
        (s->br).val_ = uVar13 >> 8;
        uVar13 = (ulong)*pbVar6 << 0x38 | uVar13 >> 8;
        (s->br).val_ = uVar13;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar6 + 1;
        bVar15 = uVar14 < bVar2;
        if (!bVar15) goto LAB_001436f5;
        uVar14 = uVar14 + 8;
        pbVar6 = pbVar6 + 1;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_001436f5:
    table = (HuffmanCode *)
            (ulong)((uint)((s->br).val_ >> ((byte)uVar10 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar10 + bVar2;
  }
  if (!bVar15) {
    s->block_length[2] = (int)table + (uint)kBlockLengthPrefixCode[local_44].offset;
  }
  else {
    s->block_length_index = local_44;
  }
  s->substate_read_block_length = (uint)bVar15;
  if (!bVar15) {
    if (local_48 == 0) {
      local_48 = s->block_type_rb[4];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[5] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    if (uVar3 <= local_48) {
      local_48 = local_48 - uVar3;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = local_48;
    s->dist_context_map_slice = s->dist_context_map + (local_48 << 2);
    s->dist_htree_index = (s->dist_context_map + (local_48 << 2))[s->distance_context];
    return 1;
  }
LAB_0014373e:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = local_38;
  (s->br).bit_pos_ = uVar4;
  (s->br).next_in = puVar5;
  (s->br).avail_in = local_40;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}